

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O1

void rgbcx::encode_bc1(void *pDst,uint8_t *pPixels,uint32_t flags,uint32_t total_orderings_to_try,
                      uint32_t total_orderings_to_try3)

{
  undefined8 uVar1;
  undefined8 uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  long lVar6;
  long lVar7;
  short sVar8;
  byte bVar9;
  short sVar10;
  uint32_t i;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint32_t uVar14;
  int iVar15;
  undefined4 uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  undefined1 uVar25;
  uint uVar20;
  uint uVar21;
  uint32_t uVar22;
  int iVar23;
  ulong uVar24;
  uint uVar26;
  uint uVar27;
  int iVar28;
  uint uVar29;
  int iVar30;
  undefined1 uVar34;
  short sVar32;
  uint32_t uVar33;
  int i_11;
  uint32_t uVar35;
  ulong uVar36;
  uint uVar37;
  uint uVar38;
  int iVar39;
  uint uVar40;
  long lVar42;
  uint uVar43;
  uint uVar44;
  ulong uVar45;
  uint8_t *puVar46;
  uint uVar47;
  uint uVar48;
  uint32_t uVar49;
  uint uVar50;
  uint32_t uVar51;
  int iVar52;
  uint32_t uVar53;
  uint32_t i_8;
  uint32_t uVar54;
  int iVar55;
  ulong uVar56;
  uint32_t uVar57;
  ulong uVar58;
  byte *pbVar59;
  bool bVar60;
  bool bVar61;
  bool bVar62;
  int iVar63;
  int iVar64;
  float fVar65;
  float fVar66;
  float fVar68;
  undefined1 auVar67 [16];
  float fVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar76;
  uint uVar78;
  undefined1 auVar77 [16];
  float fVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float in_XMM13_Da;
  float in_XMM13_Db;
  float in_XMM13_Dc;
  float in_XMM13_Dd;
  uint local_3a0;
  uint32_t local_398;
  hist3 h_1;
  uint local_384;
  bc1_encode_results results;
  uint local_338;
  ulong local_308;
  ulong local_2f8;
  undefined1 local_2e8 [16];
  ulong local_2d8;
  uint local_2bc;
  undefined8 local_2b8;
  float fStack_2b0;
  float fStack_2ac;
  ulong local_2a0;
  ulong local_298;
  ulong local_290;
  ulong local_288;
  ulong local_280;
  ulong local_278;
  undefined1 *local_270;
  uint local_264;
  uint local_260;
  uint local_25c;
  undefined8 local_258;
  float fStack_250;
  float fStack_24c;
  hist4 h;
  undefined4 uStack_244;
  uint8_t auStack_240 [8];
  uint8_t trial_sels_1 [16];
  uint8_t round_sels [16];
  uint32_t b_sum [17];
  uint8_t trial_sels [16];
  undefined8 local_b8;
  int dots [16];
  ulong uVar31;
  ulong uVar41;
  
  bVar9 = *pPixels;
  uVar50 = (uint)bVar9;
  bVar3 = pPixels[1];
  local_260 = (uint)bVar3;
  bVar4 = pPixels[2];
  uVar48 = (uint)bVar4;
  uVar11 = 0xf;
  while (((uVar17 = (ulong)uVar11, local_270 = (undefined1 *)pDst, pPixels[uVar17 * 4] == bVar9 &&
          (pPixels[uVar17 * 4 + 1] == bVar3)) && (pPixels[uVar17 * 4 + 2] == bVar4))) {
    uVar11 = uVar11 - 1;
    if (uVar11 == 0) {
      encode_bc1_solid_block(pDst,(uint)bVar9,(uint)bVar3,(uint)bVar4,(flags & 0x18) != 0);
      return;
    }
  }
  bVar61 = bVar9 == bVar3 && bVar9 == bVar4;
  local_25c = (uint)bVar9;
  local_264 = (uint)bVar4;
  bVar60 = (byte)(bVar3 | bVar9 | bVar4) < 4;
  lVar18 = 1;
  uVar40 = (uint)bVar3;
  uVar11 = local_25c;
  uVar29 = local_264;
  uVar43 = local_260;
  do {
    bVar9 = pPixels[lVar18 * 4];
    bVar3 = pPixels[lVar18 * 4 + 2];
    bVar4 = pPixels[lVar18 * 4 + 1];
    if (bVar3 != bVar9 || bVar9 != bVar4) {
      bVar61 = false;
    }
    bVar60 = (bool)(bVar60 | (byte)(bVar4 | bVar9 | bVar3) < 4);
    uVar20 = (uint)bVar9;
    if (uVar11 <= uVar20) {
      uVar11 = uVar20;
    }
    if (uVar40 <= bVar4) {
      uVar40 = (uint)bVar4;
    }
    if (uVar29 <= bVar3) {
      uVar29 = (uint)bVar3;
    }
    if (uVar20 <= local_25c) {
      local_25c = uVar20;
    }
    uVar26 = (uint)bVar4;
    if (uVar26 <= local_260) {
      local_260 = uVar26;
    }
    uVar37 = (uint)bVar3;
    if (uVar37 <= local_264) {
      local_264 = uVar37;
    }
    uVar50 = uVar50 + uVar20;
    uVar43 = uVar43 + uVar26;
    uVar48 = uVar48 + uVar37;
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x10);
  uVar20 = uVar50 + 8 >> 4;
  uVar17 = (ulong)uVar20;
  uVar26 = uVar43 + 8 >> 4;
  uVar31 = (ulong)uVar26;
  uVar37 = uVar48 + 8 >> 4;
  uVar41 = (ulong)uVar37;
  results.m_3color = false;
  results.lr = 0;
  results.lg = 0;
  results.lb = 0;
  results.hr = 0;
  results.hg = 0;
  results.hb = 0;
  if (((flags & 0xffc00112) != 0) || (((flags & 8) != 0 && (bVar60)))) {
    local_384 = 0xffffffff;
    local_278 = 0;
    local_280 = 0;
    local_288 = 0;
    local_290 = 0;
    local_298 = 0;
    local_2a0 = 0;
    iVar30 = 0;
    do {
      uVar22 = flags;
      if (iVar30 == 1) {
        uVar22 = flags & 0xfffffdbf | 0x40;
      }
      encode_bc1_pick_initial
                ((color32 *)pPixels,uVar22,bVar61,local_25c,local_260,local_264,uVar11,uVar40,uVar29
                 ,uVar20,uVar26,uVar37,uVar50,uVar43,uVar48,(int *)b_sum,dots,(int *)trial_sels_1,
                 (int *)&h,(int *)&h_1,(int *)&local_2bc);
      iVar28 = dots[0];
      uVar2 = b_sum._0_8_;
      uVar1 = trial_sels_1._0_8_;
      uVar78 = CONCAT13(h.m_hist[3],CONCAT12(h.m_hist[2],CONCAT11(h.m_hist[1],h.m_hist[0])));
      uVar19 = (ulong)_h_1;
      uVar24 = (ulong)local_2bc;
      uVar12 = bc1_find_sels4(flags,(color32 *)pPixels,b_sum[0],dots[0],trial_sels_1._0_4_,uVar78,
                              _h_1,local_2bc,round_sels,0xffffffff);
      local_2d8 = b_sum._0_8_ & 0xffffffff;
      local_2e8._0_4_ = dots[0];
      local_2f8 = trial_sels_1._0_8_ & 0xffffffff;
      local_308 = (ulong)CONCAT13(h.m_hist[3],
                                  CONCAT12(h.m_hist[2],CONCAT11(h.m_hist[1],h.m_hist[0])));
      fVar86 = (float)local_2b8;
      fVar79 = local_2b8._4_4_;
      fVar65 = fStack_2b0;
      fVar68 = fStack_2ac;
      iVar39 = 0;
      fVar66 = (float)local_258;
      uVar22 = _h_1;
      uVar33 = local_2bc;
      do {
        lVar18 = 0;
        uVar27 = 0;
        uVar21 = 0;
        uVar13 = 0;
        uVar38 = 0;
        do {
          bVar9 = round_sels[lVar18];
          uVar38 = uVar38 + *(int *)(g_weight_vals4 + (ulong)bVar9 * 4);
          uVar27 = uVar27 + (uint)pPixels[lVar18 * 4] * (uint)bVar9;
          uVar21 = uVar21 + (uint)pPixels[lVar18 * 4 + 1] * (uint)bVar9;
          uVar13 = uVar13 + (uint)pPixels[lVar18 * 4 + 2] * (uint)bVar9;
          lVar18 = lVar18 + 1;
        } while (lVar18 != 0x10);
        fVar69 = (float)(uVar38 >> 0x10 & 0xff);
        uVar44 = uVar38 >> 8 & 0xff;
        fVar72 = fVar69 * (float)(uVar38 & 0xff) - (float)(uVar44 * uVar44);
        if (1e-08 <= ABS(fVar72)) {
          fVar72 = 0.011764706 / fVar72;
          fVar69 = fVar69 * fVar72;
          fVar85 = (float)(int)(uVar50 * 3 - uVar27);
          fVar87 = (float)(int)(uVar43 * 3 - uVar21);
          fVar79 = (float)(int)(uVar48 * 3 - uVar13);
          fVar65 = (float)(uVar38 & 0xff) * fVar72;
          fVar68 = -(float)uVar44 * fVar72;
          fVar86 = fVar68 * (float)uVar27 + fVar69 * fVar85;
          fVar66 = fVar68 * (float)uVar21 + fVar69 * fVar87;
          fVar72 = (float)uVar13 * fVar65 + fVar79 * fVar68;
          fVar87 = (float)uVar21 * fVar65 + fVar87 * fVar68;
          fVar65 = (float)uVar27 * fVar65 + fVar85 * fVar68;
          fVar79 = (float)uVar13 * fVar68 + fVar79 * fVar69;
          uVar38 = (uint)(fVar65 * 31.0);
          uVar21 = (uint)(fVar72 * 31.0);
          uVar13 = (uint)(fVar86 * 31.0);
          uVar27 = (uint)(fVar79 * 31.0);
          if (0x1f < (uVar27 | uVar13 | uVar38 | uVar21)) {
            if ((int)uVar38 < 1) {
              uVar38 = 0;
            }
            if (0x1e < (int)uVar38) {
              uVar38 = 0x1f;
            }
            if ((int)uVar13 < 1) {
              uVar13 = 0;
            }
            if (0x1e < (int)uVar13) {
              uVar13 = 0x1f;
            }
            if ((int)uVar21 < 1) {
              uVar21 = 0;
            }
            if (0x1e < (int)uVar21) {
              uVar21 = 0x1f;
            }
            if ((int)uVar27 < 1) {
              uVar27 = 0;
            }
            if (0x1e < (int)uVar27) {
              uVar27 = 0x1f;
            }
          }
          uVar47 = (uint)(fVar87 * 63.0);
          uVar44 = (uint)(fVar66 * 63.0);
          if (0x3f < (uVar44 | uVar47)) {
            if ((int)uVar47 < 1) {
              uVar47 = 0;
            }
            if (0x3e < (int)uVar47) {
              uVar47 = 0x3f;
            }
            if ((int)uVar44 < 1) {
              uVar44 = 0;
            }
            if (0x3e < (int)uVar44) {
              uVar44 = 0x3f;
            }
          }
          uVar49 = uVar38 + (*(float *)(g_midpoint5 + (long)(int)uVar38 * 4) <= fVar65 &&
                            fVar65 != *(float *)(g_midpoint5 + (long)(int)uVar38 * 4)) & 0x1f;
          uVar54 = uVar47 + (*(float *)(g_midpoint6 + (long)(int)uVar47 * 4) <= fVar87 &&
                            fVar87 != *(float *)(g_midpoint6 + (long)(int)uVar47 * 4)) & 0x3f;
          uVar57 = uVar21 + (*(float *)(g_midpoint5 + (long)(int)uVar21 * 4) <= fVar72 &&
                            fVar72 != *(float *)(g_midpoint5 + (long)(int)uVar21 * 4)) & 0x1f;
          uVar51 = uVar13 + (*(float *)(g_midpoint5 + (long)(int)uVar13 * 4) <= fVar86 &&
                            fVar86 != *(float *)(g_midpoint5 + (long)(int)uVar13 * 4)) & 0x1f;
          uVar53 = uVar44 + (*(float *)(g_midpoint6 + (long)(int)uVar44 * 4) <= fVar66 &&
                            fVar66 != *(float *)(g_midpoint6 + (long)(int)uVar44 * 4)) & 0x3f;
          uVar35 = uVar27 + (*(float *)(g_midpoint5 + (long)(int)uVar27 * 4) <= fVar79 &&
                            fVar79 != *(float *)(g_midpoint5 + (long)(int)uVar27 * 4)) & 0x1f;
          fVar65 = fVar68;
          fVar79 = fVar68;
        }
        else {
          uVar51 = (uint32_t)(byte)g_bc1_match5_equals_1[uVar17 * 3];
          uVar53 = (uint32_t)(byte)g_bc1_match6_equals_1[uVar31 * 3];
          uVar35 = (uint32_t)(byte)g_bc1_match5_equals_1[uVar41 * 3];
          uVar49 = (uint32_t)(byte)g_bc1_match5_equals_1[uVar17 * 3 + 1];
          uVar54 = (uint32_t)(byte)g_bc1_match6_equals_1[uVar31 * 3 + 1];
          uVar57 = (uint32_t)(byte)g_bc1_match5_equals_1[uVar41 * 3 + 1];
        }
        if ((((uint32_t)local_2d8 == uVar51) && (local_2e8._0_4_ == uVar53)) &&
           (((float)local_2f8 == (float)uVar35 &&
            ((((uint32_t)local_308 == uVar49 && (uVar22 == uVar54)) && (uVar33 == uVar57)))))) {
          bVar62 = false;
        }
        else {
          local_258 = (byte *)CONCAT44(local_258._4_4_,fVar66);
          local_2b8 = (byte *)CONCAT44(fVar79,fVar86);
          fStack_2b0 = fVar65;
          fStack_2ac = fVar68;
          uVar14 = bc1_find_sels4(flags,(color32 *)pPixels,uVar51,uVar53,uVar35,uVar49,uVar54,uVar57
                                  ,trial_sels,uVar12);
          bVar62 = uVar14 < uVar12;
          if (bVar62) {
            round_sels[4] = trial_sels[4];
            round_sels[5] = trial_sels[5];
            round_sels[6] = trial_sels[6];
            round_sels[7] = trial_sels[7];
            round_sels[0] = trial_sels[0];
            round_sels[1] = trial_sels[1];
            round_sels[2] = trial_sels[2];
            round_sels[3] = trial_sels[3];
            round_sels[0xc] = trial_sels[0xc];
            round_sels[0xd] = trial_sels[0xd];
            round_sels[0xe] = trial_sels[0xe];
            round_sels[0xf] = trial_sels[0xf];
            round_sels[8] = trial_sels[8];
            round_sels[9] = trial_sels[9];
            round_sels[10] = trial_sels[10];
            round_sels[0xb] = trial_sels[0xb];
            local_308 = (ulong)uVar49;
            local_2f8 = (ulong)uVar35;
            local_2e8._0_4_ = uVar53;
            local_2d8 = (ulong)uVar51;
            uVar12 = uVar14;
            uVar22 = uVar54;
            uVar33 = uVar57;
          }
          fVar86 = (float)local_2b8;
          fVar79 = local_2b8._4_4_;
          fVar65 = fStack_2b0;
          fVar68 = fStack_2ac;
          fVar66 = (float)local_258;
        }
      } while (((bVar62) && ((flags & 4) != 0)) &&
              (bVar62 = iVar39 == 0, iVar39 = iVar39 + 1, bVar62));
      b_sum[0] = (uint32_t)local_2d8;
      dots[0] = local_2e8._0_4_;
      trial_sels_1[0] = (undefined1)local_2f8;
      trial_sels_1[1] = local_2f8._1_1_;
      trial_sels_1[2] = local_2f8._2_1_;
      trial_sels_1[3] = local_2f8._3_1_;
      h.m_hist[0] = (uint8_t)local_308;
      h.m_hist[1] = (uint8_t)(local_308 >> 8);
      h.m_hist[2] = (uint8_t)(local_308 >> 0x10);
      h.m_hist[3] = (uint8_t)(local_308 >> 0x18);
      _h_1 = uVar22;
      local_2bc = uVar33;
      if (uVar12 <= local_384) {
        results.lr = (uint32_t)local_2d8;
        results.lg = local_2e8._0_4_;
        results.lb = (int)(float)local_2f8;
        results.hr = (int)local_308;
        results.hg = uVar22;
        results.hb = uVar33;
        results.sels[0] = round_sels[0];
        results.sels[1] = round_sels[1];
        results.sels[2] = round_sels[2];
        results.sels[3] = round_sels[3];
        results.sels[4] = round_sels[4];
        results.sels[5] = round_sels[5];
        results.sels[6] = round_sels[6];
        results.sels[7] = round_sels[7];
        results.sels[8] = round_sels[8];
        results.sels[9] = round_sels[9];
        results.sels[10] = round_sels[10];
        results.sels[0xb] = round_sels[0xb];
        results.sels[0xc] = round_sels[0xc];
        results.sels[0xd] = round_sels[0xd];
        results.sels[0xe] = round_sels[0xe];
        results.sels[0xf] = round_sels[0xf];
        local_2a0 = uVar24;
        local_298 = uVar19;
        local_290 = (ulong)uVar78;
        local_288 = uVar1 & 0xffffffff;
        local_280 = (ulong)(uint)iVar28;
        local_278 = uVar2 & 0xffffffff;
        local_384 = uVar12;
      }
      if ((flags >> 0xe & 1) == 0) break;
      local_258 = (byte *)CONCAT44(local_258._4_4_,fVar66);
      local_2b8 = (byte *)CONCAT44(fVar79,fVar86);
      fStack_2b0 = fVar65;
      fStack_2ac = fVar68;
      bVar62 = iVar30 == 0;
      iVar30 = iVar30 + 1;
    } while (bVar62);
  }
  else {
    encode_bc1_pick_initial
              ((color32 *)pPixels,flags,bVar61,local_25c,local_260,local_264,uVar11,uVar40,uVar29,
               uVar20,uVar26,uVar37,uVar50,uVar43,uVar48,&results.lr,&results.lg,&results.lb,
               &results.hr,&results.hg,&results.hb);
    local_278 = results._0_8_ & 0xffffffff;
    local_280 = (ulong)(uint)results.lg;
    local_288 = results._8_8_ & 0xffffffff;
    local_290 = (ulong)(uint)results.hr;
    local_298 = results._16_8_ & 0xffffffff;
    local_2a0 = (ulong)(uint)results.hb;
    bc1_find_sels4_noerr
              ((color32 *)pPixels,results.lr,results.lg,results.lb,results.hr,results.hg,results.hb,
               results.sels);
    local_2b8 = g_bc1_match6_equals_1 + uVar31 * 3;
    local_258 = g_bc1_match5_equals_1 + uVar41 * 3;
    iVar30 = 0;
    while( true ) {
      lVar18 = 0;
      uVar40 = 0;
      uVar29 = 0;
      uVar11 = 0;
      uVar20 = 0;
      do {
        bVar9 = results.sels[lVar18];
        uVar20 = uVar20 + *(int *)(g_weight_vals4 + (ulong)bVar9 * 4);
        uVar40 = uVar40 + (uint)pPixels[lVar18 * 4] * (uint)bVar9;
        uVar29 = uVar29 + (uint)pPixels[lVar18 * 4 + 1] * (uint)bVar9;
        uVar11 = uVar11 + (uint)pPixels[lVar18 * 4 + 2] * (uint)bVar9;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0x10);
      fVar79 = (float)(uVar20 >> 0x10 & 0xff);
      uVar26 = uVar20 >> 8 & 0xff;
      fVar65 = fVar79 * (float)(uVar20 & 0xff) - (float)(uVar26 * uVar26);
      fVar68 = ABS(fVar65);
      if (1e-08 <= fVar68) {
        fVar65 = 0.011764706 / fVar65;
        fVar79 = fVar79 * fVar65;
        fVar69 = (float)(int)(uVar50 * 3 - uVar40);
        fVar72 = (float)(int)(uVar43 * 3 - uVar29);
        fVar66 = (float)(int)(uVar48 * 3 - uVar11);
        fVar86 = (float)(uVar20 & 0xff) * fVar65;
        fVar65 = -(float)uVar26 * fVar65;
        auVar75._4_4_ = fVar65;
        auVar75._0_4_ = fVar65;
        auVar75._8_4_ = fVar65;
        auVar75._12_4_ = fVar65;
        local_2e8._4_12_ = auVar75._4_12_;
        local_2e8._0_4_ = fVar65 * (float)uVar40 + fVar79 * fVar69;
        local_2f8._0_4_ = fVar65 * (float)uVar29 + fVar79 * fVar72;
        in_XMM13_Da = (float)uVar11 * fVar86 + fVar66 * fVar65;
        in_XMM13_Db = (float)uVar29 * fVar86 + fVar72 * fVar65;
        in_XMM13_Dc = (float)uVar40 * fVar86 + fVar69 * fVar65;
        in_XMM13_Dd = (float)uVar11 * fVar65 + fVar66 * fVar79;
      }
      if (fVar68 < 1e-08) {
        uVar35 = (uint32_t)(byte)g_bc1_match5_equals_1[uVar17 * 3];
        uVar49 = (uint32_t)*local_2b8;
        uVar33 = (uint32_t)*local_258;
        uVar22 = (uint32_t)(byte)g_bc1_match5_equals_1[uVar17 * 3 + 1];
        uVar53 = (uint32_t)local_2b8[1];
        uVar51 = (uint32_t)local_258[1];
      }
      else {
        uVar20 = (uint)(in_XMM13_Dc * 31.0);
        uVar29 = (uint)(in_XMM13_Da * 31.0);
        uVar11 = (uint)((float)local_2e8._0_4_ * 31.0);
        uVar40 = (uint)(in_XMM13_Dd * 31.0);
        if (0x1f < (uVar40 | uVar11 | uVar20 | uVar29)) {
          if ((int)uVar20 < 1) {
            uVar20 = 0;
          }
          if (0x1e < (int)uVar20) {
            uVar20 = 0x1f;
          }
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          if (0x1e < (int)uVar11) {
            uVar11 = 0x1f;
          }
          if ((int)uVar29 < 1) {
            uVar29 = 0;
          }
          if (0x1e < (int)uVar29) {
            uVar29 = 0x1f;
          }
          if ((int)uVar40 < 1) {
            uVar40 = 0;
          }
          if (0x1e < (int)uVar40) {
            uVar40 = 0x1f;
          }
        }
        uVar37 = (uint)(in_XMM13_Db * 63.0);
        uVar26 = (uint)((float)local_2f8 * 63.0);
        if (0x3f < (uVar26 | uVar37)) {
          if ((int)uVar37 < 1) {
            uVar37 = 0;
          }
          if (0x3e < (int)uVar37) {
            uVar37 = 0x3f;
          }
          if ((int)uVar26 < 1) {
            uVar26 = 0;
          }
          if (0x3e < (int)uVar26) {
            uVar26 = 0x3f;
          }
        }
        uVar22 = uVar20 + (*(float *)(g_midpoint5 + (long)(int)uVar20 * 4) <= in_XMM13_Dc &&
                          in_XMM13_Dc != *(float *)(g_midpoint5 + (long)(int)uVar20 * 4)) & 0x1f;
        uVar53 = uVar37 + (*(float *)(g_midpoint6 + (long)(int)uVar37 * 4) <= in_XMM13_Db &&
                          in_XMM13_Db != *(float *)(g_midpoint6 + (long)(int)uVar37 * 4)) & 0x3f;
        uVar51 = uVar29 + (*(float *)(g_midpoint5 + (long)(int)uVar29 * 4) <= in_XMM13_Da &&
                          in_XMM13_Da != *(float *)(g_midpoint5 + (long)(int)uVar29 * 4)) & 0x1f;
        uVar35 = uVar11 + (*(float *)(g_midpoint5 + (long)(int)uVar11 * 4) <= (float)local_2e8._0_4_
                          && (float)local_2e8._0_4_ !=
                             *(float *)(g_midpoint5 + (long)(int)uVar11 * 4)) & 0x1f;
        uVar49 = uVar26 + (*(float *)(g_midpoint6 + (long)(int)uVar26 * 4) <= (float)local_2f8 &&
                          (float)local_2f8 != *(float *)(g_midpoint6 + (long)(int)uVar26 * 4)) &
                 0x3f;
        uVar33 = uVar40 + (*(float *)(g_midpoint5 + (long)(int)uVar40 * 4) <= in_XMM13_Dd &&
                          in_XMM13_Dd != *(float *)(g_midpoint5 + (long)(int)uVar40 * 4)) & 0x1f;
      }
      local_384 = 0xffffffff;
      if (((results.lr == uVar35) && (results.lg == uVar49)) &&
         ((results.lb == uVar33 &&
          (((results.hr == uVar22 && (results.hg == uVar53)) && (results.hb == uVar51)))))) break;
      bc1_find_sels4_noerr
                ((color32 *)pPixels,uVar35,uVar49,uVar33,uVar22,uVar53,uVar51,results.sels);
      results.lg = uVar49;
      results.lr = uVar35;
      results.hr = uVar22;
      results.lb = uVar33;
      results.hb = uVar51;
      results.hg = uVar53;
      if (((flags & 4) == 0) || (bVar61 = iVar30 != 0, iVar30 = iVar30 + 1, bVar61)) break;
    }
  }
  uVar11 = local_384;
  if (((flags & 2) != 0) && (local_384 != 0)) {
    uVar22 = 0x80;
    if ((int)total_orderings_to_try < 0x80) {
      uVar22 = total_orderings_to_try;
    }
    uVar11 = 1;
    if (1 < (int)uVar22) {
      uVar11 = uVar22;
    }
    local_2b8 = (byte *)CONCAT44(local_2b8._4_4_,uVar43 * 3);
    local_258 = (byte *)CONCAT44(local_258._4_4_,uVar48 * 3);
    uVar19 = 0x3c9;
    if ((flags >> 0xd & 1) == 0) {
      uVar19 = (ulong)uVar11;
    }
    iVar30 = 0;
    do {
      h.m_hist[0] = '\0';
      h.m_hist[1] = '\0';
      h.m_hist[2] = '\0';
      h.m_hist[3] = '\0';
      lVar18 = 0x18;
      do {
        h.m_hist[results.sels[lVar18 + -0x18]] = h.m_hist[results.sels[lVar18 + -0x18]] + '\x01';
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0x28);
      local_3a0 = 0xf;
      if (((h.m_hist[0] != '\x10') && (local_3a0 = 700, h.m_hist[1] != '\x10')) &&
         ((local_3a0 = 0x2f1, h.m_hist[2] != '\x10' && (local_3a0 = 0x203, h.m_hist[3] != '\x10'))))
      {
        local_3a0 = (uint)*(ushort *)
                           (g_total_ordering4_hash +
                           ((uint)h.m_hist[2] << 9 | (uint)h.m_hist[1] << 5 | (uint)h.m_hist[0] * 2)
                           );
      }
      lVar18 = 0;
      do {
        dots[lVar18] = (uint)pPixels[lVar18 * 4 + 2] *
                       (((uint)results.hb >> 2 | results.hb * 8) -
                       ((uint)results.lb >> 2 | results.lb * 8)) * 0x10 +
                       (uint)pPixels[lVar18 * 4 + 1] *
                       (((uint)results.hg >> 4 | results.hg * 4) -
                       ((uint)results.lg >> 4 | results.lg * 4)) * 0x10 +
                       (uint)pPixels[lVar18 * 4] *
                       (((uint)results.hr >> 2 | results.hr * 8) -
                       ((uint)results.lr >> 2 | results.lr * 8)) * 0x10 + (int)lVar18 + 0x10000000;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0x10);
      std::__insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(dots);
      lVar18 = 0;
      uVar22 = 0;
      iVar28 = 0;
      iVar39 = 0;
      do {
        uVar24 = (ulong)(dots[lVar18] & 0xf);
        *(int *)(round_sels + lVar18 * 4) = iVar39;
        *(int *)(trial_sels + lVar18 * 4) = iVar28;
        b_sum[lVar18] = uVar22;
        iVar39 = iVar39 + (uint)pPixels[uVar24 * 4];
        iVar28 = iVar28 + (uint)pPixels[uVar24 * 4 + 1];
        uVar22 = uVar22 + pPixels[uVar24 * 4 + 2];
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0x10);
      b_sum[0x10] = uVar48;
      uVar24 = 0;
      uVar11 = local_384;
      do {
        if ((flags >> 0xd & 1) == 0) {
          uVar29 = (uint)*(ushort *)(g_best_total_orderings4 + (ulong)(local_3a0 << 8) + uVar24 * 2)
          ;
        }
        else {
          uVar29 = (uint)uVar24;
        }
        if ((int)uVar29 < 700) {
          if ((uVar29 == 0xf) || (uVar29 == 0x203)) goto LAB_00119da7;
LAB_00119e70:
          auVar70._0_8_ = (ulong)uVar29;
          bVar9 = (&g_unique_total_orders4)[auVar70._0_8_ * 4];
          uVar36 = (ulong)(((uint)(byte)(&DAT_00124411)[auVar70._0_8_ * 4] + (uint)bVar9) * 4);
          lVar18 = (ulong)bVar9 * 4;
          uVar45 = (ulong)(((uint)(byte)(&DAT_00124412)[auVar70._0_8_ * 4] +
                           (uint)(byte)(&DAT_00124411)[auVar70._0_8_ * 4] + (uint)bVar9) * 4);
          uVar29 = (uVar50 - *(int *)(round_sels + uVar45)) * 3 +
                   (-*(int *)(round_sels + uVar36) - *(int *)(round_sels + lVar18)) +
                   *(int *)(round_sels + uVar45) * 2;
          uVar20 = (uVar43 - *(int *)(trial_sels + uVar45)) * 3 +
                   (-*(int *)(trial_sels + uVar36) - *(int *)(trial_sels + lVar18)) +
                   *(int *)(trial_sels + uVar45) * 2;
          fVar76 = (float)(uVar50 * 3 - uVar29);
          uVar40 = (uVar48 - *(int *)((long)b_sum + uVar45)) * 3 +
                   (-*(int *)((long)b_sum + uVar36) - b_sum[bVar9]) +
                   *(int *)((long)b_sum + uVar45) * 2;
          fVar85 = (float)((int)(float)local_2b8 - uVar20);
          fVar69 = (float)((int)(float)local_258 - uVar40);
          fVar86 = (float)uVar29;
          fVar68 = (float)uVar20;
          fVar84 = (float)uVar40;
          uVar1 = *(undefined8 *)((long)&g_selector_factors4 + auVar70._0_8_ * 0xc);
          uVar2 = *(undefined8 *)((long)&g_selector_factors4 + auVar70._0_8_ * 0xc + 4);
          fVar82 = (float)uVar2;
          fVar83 = (float)((ulong)uVar2 >> 0x20);
          fVar66 = (float)uVar1;
          fVar72 = (float)((ulong)uVar1 >> 0x20);
          fVar65 = fVar68 * fVar66 + fVar85 * fVar82;
          fVar79 = fVar68 * fVar72 + fVar85 * fVar83;
          fVar87 = fVar66 * fVar84 + fVar69 * fVar72;
          fVar69 = fVar72 * fVar84 + (float)(&DAT_0016d598)[auVar70._0_8_ * 3] * fVar69;
          uVar40 = (uint)(fVar87 * 31.0);
          fVar66 = fVar86 * fVar66 + fVar76 * fVar82;
          fVar86 = fVar86 * fVar72 + fVar76 * fVar83;
          uVar26 = (uint)(fVar66 * 31.0);
          uVar29 = (uint)(fVar86 * 31.0);
          uVar20 = (uint)(fVar69 * 31.0);
          if (0x1f < (uVar26 | uVar40 | uVar29 | uVar20)) {
            if ((int)uVar26 < 1) {
              uVar26 = 0;
            }
            if (0x1e < (int)uVar26) {
              uVar26 = 0x1f;
            }
            if ((int)uVar29 < 1) {
              uVar29 = 0;
            }
            if (0x1e < (int)uVar29) {
              uVar29 = 0x1f;
            }
            if ((int)uVar40 < 1) {
              uVar40 = 0;
            }
            if (0x1e < (int)uVar40) {
              uVar40 = 0x1f;
            }
            if ((int)uVar20 < 1) {
              uVar20 = 0;
            }
            if (0x1e < (int)uVar20) {
              uVar20 = 0x1f;
            }
          }
          uVar37 = (uint)(fVar65 * 63.0);
          uVar78 = (uint)(fVar79 * 63.0);
          auVar70._0_8_ = CONCAT44(uVar78,uVar37);
          auVar70._8_4_ = (int)((fVar68 * 0.0 + fVar85 * 0.0) * 0.0);
          auVar70._12_4_ = (int)((fVar68 * 0.0 + fVar85 * 0.0) * 0.0);
          if (0x3f < (uVar78 | uVar37)) {
            auVar80._0_4_ = -(uint)((int)0 < (int)uVar37);
            auVar80._4_4_ = -(uint)((int)0 < (int)uVar78);
            auVar80._8_4_ = -(uint)((int)0 < auVar70._8_4_);
            auVar80._12_4_ = -(uint)((int)0 < auVar70._12_4_);
            auVar80 = auVar80 & auVar70;
            auVar70._0_8_ =
                 CONCAT44(-(uint)(auVar80._4_4_ < DAT_00124220._4_4_),
                          -(uint)(auVar80._0_4_ < (int)DAT_00124220));
            auVar70._0_8_ = ~auVar70._0_8_ & (ulong)DAT_00124220 | auVar80._0_8_ & auVar70._0_8_;
          }
          uVar49 = uVar26 + (*(float *)(g_midpoint5 + (long)(int)uVar26 * 4) <= fVar66 &&
                            fVar66 != *(float *)(g_midpoint5 + (long)(int)uVar26 * 4)) & 0x1f;
          uVar53 = (int)auVar70._0_8_ +
                   (uint)(*(float *)(g_midpoint6 + (long)(int)auVar70._0_8_ * 4) <= fVar65 &&
                         fVar65 != *(float *)(g_midpoint6 + (long)(int)auVar70._0_8_ * 4)) & 0x3f;
          uVar51 = uVar40 + (*(float *)(g_midpoint5 + (long)(int)uVar40 * 4) <= fVar87 &&
                            fVar87 != *(float *)(g_midpoint5 + (long)(int)uVar40 * 4)) & 0x1f;
          uVar22 = uVar29 + (*(float *)(g_midpoint5 + (long)(int)uVar29 * 4) <= fVar86 &&
                            fVar86 != *(float *)(g_midpoint5 + (long)(int)uVar29 * 4)) & 0x1f;
          iVar28 = (int)(auVar70._0_8_ >> 0x20);
          uVar35 = iVar28 + (uint)(*(float *)(g_midpoint6 + (long)iVar28 * 4) <= fVar79 &&
                                  fVar79 != *(float *)(g_midpoint6 + (long)iVar28 * 4)) & 0x3f;
          uVar33 = uVar20 + (*(float *)(g_midpoint5 + (long)(int)uVar20 * 4) <= fVar69 &&
                            fVar69 != *(float *)(g_midpoint5 + (long)(int)uVar20 * 4)) & 0x1f;
        }
        else {
          if ((uVar29 != 0x2f1) && (uVar29 != 700)) goto LAB_00119e70;
LAB_00119da7:
          uVar22 = (uint32_t)(byte)g_bc1_match5_equals_1[uVar17 * 3];
          uVar35 = (uint32_t)(byte)g_bc1_match6_equals_1[uVar31 * 3];
          uVar33 = (uint32_t)(byte)g_bc1_match5_equals_1[uVar41 * 3];
          uVar49 = (uint32_t)(byte)g_bc1_match5_equals_1[uVar17 * 3 + 1];
          uVar53 = (uint32_t)(byte)g_bc1_match6_equals_1[uVar31 * 3 + 1];
          uVar51 = (uint32_t)(byte)g_bc1_match5_equals_1[uVar41 * 3 + 1];
        }
        uVar54 = bc1_find_sels4(flags,(color32 *)pPixels,uVar22,uVar35,uVar33,uVar49,uVar53,uVar51,
                                trial_sels_1,uVar11);
        if (uVar54 < uVar11) {
          results.lg = uVar35;
          results.lr = uVar22;
          results.hr = uVar49;
          results.lb = uVar33;
          results.hb = uVar51;
          results.hg = uVar53;
          results.sels[0] = trial_sels_1[0];
          results.sels[1] = trial_sels_1[1];
          results.sels[2] = trial_sels_1[2];
          results.sels[3] = trial_sels_1[3];
          results.sels[4] = trial_sels_1[4];
          results.sels[5] = trial_sels_1[5];
          results.sels[6] = trial_sels_1[6];
          results.sels[7] = trial_sels_1[7];
          results.sels[8] = trial_sels_1[8];
          results.sels[9] = trial_sels_1[9];
          results.sels[10] = trial_sels_1[10];
          results.sels[0xb] = trial_sels_1[0xb];
          results.sels[0xc] = trial_sels_1[0xc];
          results.sels[0xd] = trial_sels_1[0xd];
          results.sels[0xe] = trial_sels_1[0xe];
          results.sels[0xf] = trial_sels_1[0xf];
          uVar11 = uVar54;
        }
        uVar24 = uVar24 + 1;
      } while (uVar19 != uVar24);
    } while ((((uVar11 != 0) && (uVar11 != local_384)) && ((flags & 0x20) != 0)) &&
            (bVar61 = iVar30 == 0, local_384 = uVar11, iVar30 = iVar30 + 1, bVar61));
  }
  if (((flags & 0x18) != 0) && (uVar11 != 0)) {
    if ((flags & 0x10) != 0) {
      uVar29 = bc1_find_sels3_fullerr
                         (false,(color32 *)pPixels,(uint32_t)local_278,(uint32_t)local_280,
                          (uint32_t)local_288,(uint32_t)local_290,(uint32_t)local_298,
                          (uint32_t)local_2a0,trial_sels_1,0xffffffff);
      if (uVar29 == 0) {
        uVar29 = 0;
      }
      else {
        local_2b8 = g_bc1_match5_half + uVar41 * 3;
        iVar30 = 0;
        do {
          lVar18 = 0;
          iVar28 = 0;
          uVar40 = 0;
          iVar39 = 0;
          iVar63 = 0;
          iVar64 = 0;
          auVar75 = ZEXT816(0);
          do {
            uVar19 = (ulong)trial_sels_1[lVar18];
            auVar67 = auVar75;
            if (uVar19 != 3) {
              uVar40 = uVar40 + (&g_weight_vals3)[uVar19];
              bVar9 = *(byte *)((long)&compute_least_squares_endpoints3_rgb(bool,rgbcx::color32_const*,unsigned_char_const*,rgbcx::vec3F*,rgbcx::vec3F*)
                                       ::s_tran + uVar19);
              iVar28 = iVar28 + (uint)bVar9 * (uint)pPixels[lVar18 * 4 + 1];
              auVar73._8_8_ = 0;
              auVar73._0_8_ =
                   (ulong)pPixels[lVar18 * 4] | (ulong)(uint)pPixels[lVar18 * 4 + 2] << 0x20;
              auVar70 = pmaddwd(ZEXT516(CONCAT14(bVar9,(uint)bVar9)),auVar73);
              auVar67._0_4_ = auVar75._0_4_ + auVar70._0_4_;
              auVar67._4_4_ = auVar75._4_4_ + auVar70._4_4_;
              auVar67._8_4_ = auVar75._8_4_ + auVar70._8_4_;
              auVar67._12_4_ = auVar75._12_4_ + auVar70._12_4_;
              iVar39 = iVar39 + (uint)pPixels[lVar18 * 4 + 1];
              iVar63 = iVar63 + (uint)pPixels[lVar18 * 4];
              iVar64 = iVar64 + (uint)pPixels[lVar18 * 4 + 2];
            }
            lVar18 = lVar18 + 1;
            auVar75 = auVar67;
          } while (lVar18 != 0x10);
          fVar68 = (float)(uVar40 >> 0x10 & 0xff);
          uVar20 = uVar40 >> 8 & 0xff;
          fVar65 = fVar68 * (float)(uVar40 & 0xff) - (float)(uVar20 * uVar20);
          if (1e-08 <= ABS(fVar65)) {
            fVar65 = 0.007843138 / fVar65;
            fVar68 = fVar68 * fVar65;
            fVar69 = (float)(iVar39 * 2 - iVar28);
            fVar72 = (float)auVar67._0_4_;
            fVar87 = (float)auVar67._4_4_;
            fVar66 = -(float)uVar20 * fVar65;
            fVar65 = (float)(uVar40 & 0xff) * fVar65;
            fVar79 = (float)(iVar63 * 2 - auVar67._0_4_);
            fVar86 = (float)(iVar64 * 2 - auVar67._4_4_);
            fVar85 = fVar68 * fVar79 + fVar66 * fVar72;
            fVar79 = fVar66 * fVar79 + fVar65 * fVar72;
            fVar72 = fVar68 * fVar86 + fVar66 * fVar87;
            fVar86 = fVar66 * fVar86 + fVar65 * fVar87;
            fVar68 = (float)iVar28 * fVar66 + fVar69 * fVar68;
            fVar65 = (float)iVar28 * fVar65 + fVar69 * fVar66;
            uVar40 = (uint)(fVar85 * 31.0);
            uVar20 = (uint)(fVar79 * 31.0);
            uVar26 = (uint)(fVar72 * 31.0);
            uVar37 = (uint)(fVar86 * 31.0);
            if (0x1f < (uVar37 | uVar20 | uVar26 | uVar40)) {
              uVar40 = -(uint)((int)0 < (int)uVar40) & uVar40;
              uVar20 = -(uint)((int)0 < (int)uVar20) & uVar20;
              uVar26 = -(uint)((int)0 < (int)uVar26) & uVar26;
              uVar37 = -(uint)((int)0 < (int)uVar37) & uVar37;
              uVar78 = -(uint)((int)uVar40 < 0x1f);
              uVar12 = -(uint)((int)uVar20 < 0x1f);
              uVar13 = -(uint)((int)uVar26 < 0x1f);
              uVar21 = -(uint)((int)uVar37 < 0x1f);
              uVar40 = ~uVar78 & 0x1f | uVar40 & uVar78;
              uVar20 = ~uVar12 & 0x1f | uVar20 & uVar12;
              uVar26 = ~uVar13 & 0x1f | uVar26 & uVar13;
              uVar37 = ~uVar21 & 0x1f | uVar37 & uVar21;
            }
            uVar12 = (uint)(fVar65 * 63.0);
            uVar78 = (uint)(fVar68 * 63.0);
            if (0x3f < (uVar12 | uVar78)) {
              if ((int)uVar12 < 1) {
                uVar12 = 0;
              }
              if (0x3e < (int)uVar12) {
                uVar12 = 0x3f;
              }
              if ((int)uVar78 < 1) {
                uVar78 = 0;
              }
              if (0x3e < (int)uVar78) {
                uVar78 = 0x3f;
              }
            }
            auVar70._0_8_ =
                 (ulong)(uVar20 + (*(float *)(g_midpoint5 + (long)(int)uVar20 * 4) <= fVar79 &&
                                  fVar79 != *(float *)(g_midpoint5 + (long)(int)uVar20 * 4)) & 0x1f)
            ;
            uVar24 = (ulong)(uVar12 + (*(float *)(g_midpoint6 + (long)(int)uVar12 * 4) <= fVar65 &&
                                      fVar65 != *(float *)(g_midpoint6 + (long)(int)uVar12 * 4)) &
                            0x3f);
            auVar77._0_8_ =
                 (ulong)(uVar37 + (*(float *)(g_midpoint5 + (long)(int)uVar37 * 4) <= fVar86 &&
                                  fVar86 != *(float *)(g_midpoint5 + (long)(int)uVar37 * 4)) & 0x1f)
            ;
            uVar36 = (ulong)(uVar40 + (*(float *)(g_midpoint5 + (long)(int)uVar40 * 4) <= fVar85 &&
                                      fVar85 != *(float *)(g_midpoint5 + (long)(int)uVar40 * 4)) &
                            0x1f);
            uVar45 = (ulong)(uVar78 + (*(float *)(g_midpoint6 + (long)(int)uVar78 * 4) <= fVar68 &&
                                      fVar68 != *(float *)(g_midpoint6 + (long)(int)uVar78 * 4)) &
                            0x3f);
            uVar19 = (ulong)(uVar26 + (*(float *)(g_midpoint5 + (long)(int)uVar26 * 4) <= fVar72 &&
                                      fVar72 != *(float *)(g_midpoint5 + (long)(int)uVar26 * 4)) &
                            0x1f);
          }
          else {
            uVar36 = (ulong)(byte)g_bc1_match5_half[uVar17 * 3];
            uVar45 = (ulong)(byte)g_bc1_match6_half[uVar31 * 3];
            uVar19 = (ulong)*local_2b8;
            auVar70._0_8_ = (ulong)(byte)g_bc1_match5_half[uVar17 * 3 + 1];
            uVar24 = (ulong)(byte)g_bc1_match6_half[uVar31 * 3 + 1];
            auVar77._0_8_ = (ulong)local_2b8[1];
          }
          if ((((uint32_t)local_278 == (uint32_t)uVar36) &&
              ((uint32_t)local_280 == (uint32_t)uVar45)) &&
             (((uint32_t)local_288 == (uint32_t)uVar19 &&
              ((((uint32_t)local_290 == (uint32_t)auVar70._0_8_ &&
                ((uint32_t)local_298 == (uint32_t)uVar24)) &&
               ((uint32_t)local_2a0 == (uint32_t)auVar77._0_8_)))))) {
            bVar61 = false;
          }
          else {
            uVar22 = bc1_find_sels3_fullerr
                               (false,(color32 *)pPixels,(uint32_t)uVar36,(uint32_t)uVar45,
                                (uint32_t)uVar19,(uint32_t)auVar70._0_8_,(uint32_t)uVar24,
                                (uint32_t)auVar77._0_8_,round_sels,uVar29);
            bVar61 = uVar22 < uVar29;
            if (bVar61) {
              trial_sels_1[0] = round_sels[0];
              trial_sels_1[1] = round_sels[1];
              trial_sels_1[2] = round_sels[2];
              trial_sels_1[3] = round_sels[3];
              trial_sels_1[4] = round_sels[4];
              trial_sels_1[5] = round_sels[5];
              trial_sels_1[6] = round_sels[6];
              trial_sels_1[7] = round_sels[7];
              trial_sels_1[8] = round_sels[8];
              trial_sels_1[9] = round_sels[9];
              trial_sels_1[10] = round_sels[10];
              trial_sels_1[0xb] = round_sels[0xb];
              trial_sels_1[0xc] = round_sels[0xc];
              trial_sels_1[0xd] = round_sels[0xd];
              trial_sels_1[0xe] = round_sels[0xe];
              trial_sels_1[0xf] = round_sels[0xf];
              local_2a0 = auVar77._0_8_;
              local_298 = uVar24;
              local_290 = auVar70._0_8_;
              local_288 = uVar19;
              local_280 = uVar45;
              local_278 = uVar36;
              uVar29 = uVar22;
            }
          }
        } while (((bVar61) && ((flags & 4) != 0)) &&
                (bVar61 = iVar30 == 0, iVar30 = iVar30 + 1, bVar61));
      }
      if (uVar29 == 0) {
        uVar29 = 0;
      }
      else if (total_orderings_to_try3 != 0 && (flags & 2) != 0) {
        _h_1 = _h_1 & 0xff000000;
        lVar18 = 0;
        do {
          h_1.m_hist[trial_sels_1[lVar18]] = h_1.m_hist[trial_sels_1[lVar18]] + '\x01';
          lVar18 = lVar18 + 1;
        } while (lVar18 != 0x10);
        local_338 = 0xc;
        if (h_1.m_hist[0] != '\x10') {
          local_338 = 0xf;
          if (h_1.m_hist[1] != '\x10') {
            local_338 = 0x59;
            if (h_1.m_hist[2] != '\x10') {
              local_338 = (uint)*(ushort *)
                                 (g_total_ordering3_hash +
                                 ((uint)h_1.m_hist[1] << 5 | (_h_1 & 0xff) * 2));
            }
          }
        }
        lVar18 = 0;
        do {
          dots[lVar18] = (uint)pPixels[lVar18 * 4 + 2] *
                         (((uint)(local_2a0 >> 2) & 0x3fffffff | (int)local_2a0 * 8) -
                         ((uint)(local_288 >> 2) & 0x3fffffff | (int)local_288 * 8)) * 0x10 +
                         (uint)pPixels[lVar18 * 4 + 1] *
                         (((uint)(local_298 >> 4) & 0xfffffff | (int)local_298 * 4) -
                         ((uint)(local_280 >> 4) & 0xfffffff | (int)local_280 * 4)) * 0x10 +
                         (uint)pPixels[lVar18 * 4] *
                         (((uint)(local_290 >> 2) & 0x3fffffff | (int)local_290 * 8) -
                         ((uint)(local_278 >> 2) & 0x3fffffff | (int)local_278 * 8)) * 0x10 +
                         (int)lVar18 + 0x10000000;
          lVar18 = lVar18 + 1;
        } while (lVar18 != 0x10);
        std::__insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(dots);
        lVar18 = 0;
        uVar22 = 0;
        iVar30 = 0;
        iVar28 = 0;
        do {
          uVar19 = (ulong)(dots[lVar18] & 0xf);
          *(int *)(round_sels + lVar18 * 4) = iVar28;
          *(int *)(trial_sels + lVar18 * 4) = iVar30;
          b_sum[lVar18] = uVar22;
          iVar28 = iVar28 + (uint)pPixels[uVar19 * 4];
          iVar30 = iVar30 + (uint)pPixels[uVar19 * 4 + 1];
          uVar22 = uVar22 + pPixels[uVar19 * 4 + 2];
          lVar18 = lVar18 + 1;
        } while (lVar18 != 0x10);
        b_sum[0x10] = uVar48;
        uVar22 = 0x20;
        if (total_orderings_to_try3 < 0x20) {
          uVar22 = total_orderings_to_try3;
        }
        local_2b8 = (byte *)CONCAT44(local_2b8._4_4_,uVar50 * 2);
        local_258 = (byte *)CONCAT44(local_258._4_4_,uVar43 * 2);
        uVar19 = 0x99;
        if ((flags >> 0xd & 1) == 0) {
          uVar19 = (ulong)(uVar22 + (uVar22 == 0));
        }
        uVar24 = 0;
        do {
          if ((flags >> 0xd & 1) == 0) {
            uVar40 = (uint)(byte)g_best_total_orderings3[(local_338 << 5) + uVar24];
          }
          else {
            uVar40 = (uint)uVar24;
          }
          if (((uVar40 == 0xc) || (uVar40 == 0x59)) || (uVar40 == 0xf)) {
            uVar45 = (ulong)(byte)g_bc1_match5_half[uVar17 * 3];
            auVar70._0_8_ = (ulong)(byte)g_bc1_match6_half[uVar31 * 3];
            auVar77._0_8_ = (ulong)(byte)g_bc1_match5_half[uVar41 * 3];
            uVar58 = (ulong)(byte)g_bc1_match5_half[uVar17 * 3 + 1];
            uVar56 = (ulong)(byte)g_bc1_match6_half[uVar31 * 3 + 1];
            uVar36 = (ulong)(byte)g_bc1_match5_half[uVar41 * 3 + 1];
          }
          else {
            auVar70._0_8_ = (ulong)uVar40;
            bVar9 = (&g_unique_total_orders3)[auVar70._0_8_ * 3];
            uVar36 = (ulong)(((uint)(byte)(&DAT_00125342)[auVar70._0_8_ * 3] + (uint)bVar9) * 4);
            lVar18 = (ulong)bVar9 * 4;
            uVar40 = (-*(int *)(round_sels + uVar36) - *(int *)(round_sels + lVar18)) + uVar50 * 2;
            fVar76 = (float)((int)(float)local_2b8 - uVar40);
            uVar20 = (-*(int *)(trial_sels + uVar36) - *(int *)(trial_sels + lVar18)) + uVar43 * 2;
            uVar26 = (-*(int *)((long)b_sum + uVar36) - b_sum[bVar9]) + uVar48 * 2;
            fVar85 = (float)((int)(float)local_258 - uVar20);
            fVar69 = (float)(uVar48 * 2 - uVar26);
            fVar86 = (float)uVar40;
            fVar68 = (float)uVar20;
            fVar84 = (float)uVar26;
            uVar1 = *(undefined8 *)((long)&g_selector_factors3 + auVar70._0_8_ * 0xc);
            uVar2 = *(undefined8 *)((long)&g_selector_factors3 + auVar70._0_8_ * 0xc + 4);
            fVar82 = (float)uVar2;
            fVar83 = (float)((ulong)uVar2 >> 0x20);
            fVar66 = (float)uVar1;
            fVar72 = (float)((ulong)uVar1 >> 0x20);
            fVar65 = fVar68 * fVar66 + fVar85 * fVar82;
            fVar79 = fVar68 * fVar72 + fVar85 * fVar83;
            fVar87 = fVar66 * fVar84 + fVar69 * fVar72;
            fVar69 = fVar72 * fVar84 + (float)(&DAT_00170508)[auVar70._0_8_ * 3] * fVar69;
            uVar20 = (uint)(fVar87 * 31.0);
            fVar66 = fVar86 * fVar66 + fVar76 * fVar82;
            fVar86 = fVar86 * fVar72 + fVar76 * fVar83;
            uVar37 = (uint)(fVar66 * 31.0);
            uVar40 = (uint)(fVar86 * 31.0);
            uVar26 = (uint)(fVar69 * 31.0);
            if (0x1f < (uVar37 | uVar20 | uVar40 | uVar26)) {
              if ((int)uVar37 < 1) {
                uVar37 = 0;
              }
              if (0x1e < (int)uVar37) {
                uVar37 = 0x1f;
              }
              if ((int)uVar40 < 1) {
                uVar40 = 0;
              }
              if (0x1e < (int)uVar40) {
                uVar40 = 0x1f;
              }
              if ((int)uVar20 < 1) {
                uVar20 = 0;
              }
              if (0x1e < (int)uVar20) {
                uVar20 = 0x1f;
              }
              if ((int)uVar26 < 1) {
                uVar26 = 0;
              }
              if (0x1e < (int)uVar26) {
                uVar26 = 0x1f;
              }
            }
            uVar78 = (uint)(fVar65 * 63.0);
            uVar12 = (uint)(fVar79 * 63.0);
            auVar77._0_8_ = CONCAT44(uVar12,uVar78);
            auVar77._8_4_ = (int)((fVar68 * 0.0 + fVar85 * 0.0) * 0.0);
            auVar77._12_4_ = (int)((fVar68 * 0.0 + fVar85 * 0.0) * 0.0);
            if (0x3f < (uVar12 | uVar78)) {
              auVar81._0_4_ = -(uint)((int)0 < (int)uVar78);
              auVar81._4_4_ = -(uint)((int)0 < (int)uVar12);
              auVar81._8_4_ = -(uint)((int)0 < auVar77._8_4_);
              auVar81._12_4_ = -(uint)((int)0 < auVar77._12_4_);
              auVar81 = auVar81 & auVar77;
              auVar70._0_8_ =
                   CONCAT44(-(uint)(auVar81._4_4_ < DAT_00124220._4_4_),
                            -(uint)(auVar81._0_4_ < (int)DAT_00124220));
              auVar77._0_8_ = ~auVar70._0_8_ & (ulong)DAT_00124220 | auVar81._0_8_ & auVar70._0_8_;
            }
            uVar58 = (ulong)(uVar37 + (*(float *)(g_midpoint5 + (long)(int)uVar37 * 4) <= fVar66 &&
                                      fVar66 != *(float *)(g_midpoint5 + (long)(int)uVar37 * 4)) &
                            0x1f);
            uVar56 = (ulong)((int)auVar77._0_8_ +
                             (uint)(*(float *)(g_midpoint6 + (long)(int)auVar77._0_8_ * 4) <= fVar65
                                   && fVar65 != *(float *)(g_midpoint6 +
                                                          (long)(int)auVar77._0_8_ * 4)) & 0x3f);
            uVar36 = (ulong)(uVar20 + (*(float *)(g_midpoint5 + (long)(int)uVar20 * 4) <= fVar87 &&
                                      fVar87 != *(float *)(g_midpoint5 + (long)(int)uVar20 * 4)) &
                            0x1f);
            uVar45 = (ulong)(uVar40 + (*(float *)(g_midpoint5 + (long)(int)uVar40 * 4) <= fVar86 &&
                                      fVar86 != *(float *)(g_midpoint5 + (long)(int)uVar40 * 4)) &
                            0x1f);
            iVar30 = (int)(auVar77._0_8_ >> 0x20);
            auVar70._0_8_ =
                 (ulong)(iVar30 + (uint)(*(float *)(g_midpoint6 + (long)iVar30 * 4) <= fVar79 &&
                                        fVar79 != *(float *)(g_midpoint6 + (long)iVar30 * 4)) & 0x3f
                        );
            auVar77._0_8_ =
                 (ulong)(uVar26 + (*(float *)(g_midpoint5 + (long)(int)uVar26 * 4) <= fVar69 &&
                                  fVar69 != *(float *)(g_midpoint5 + (long)(int)uVar26 * 4)) & 0x1f)
            ;
          }
          uVar22 = bc1_find_sels3_fullerr
                             (false,(color32 *)pPixels,(uint32_t)uVar45,(uint32_t)auVar70._0_8_,
                              (uint32_t)auVar77._0_8_,(uint32_t)uVar58,(uint32_t)uVar56,
                              (uint32_t)uVar36,h.m_hist,0xffffffff);
          if (uVar22 < uVar29) {
            trial_sels_1[0] = h.m_hist[0];
            trial_sels_1[1] = h.m_hist[1];
            trial_sels_1[2] = h.m_hist[2];
            trial_sels_1[3] = h.m_hist[3];
            trial_sels_1[4] = (uint8_t)uStack_244;
            trial_sels_1[5] = (uint8_t)((uint)uStack_244 >> 8);
            trial_sels_1[6] = (uint8_t)((uint)uStack_244 >> 0x10);
            trial_sels_1[7] = (uint8_t)((uint)uStack_244 >> 0x18);
            trial_sels_1._8_8_ = auStack_240;
            local_2a0 = uVar36;
            local_298 = uVar56;
            local_290 = uVar58;
            local_288 = auVar77._0_8_;
            local_280 = auVar70._0_8_;
            local_278 = uVar45;
            uVar29 = uVar22;
          }
          uVar24 = uVar24 + 1;
        } while (uVar19 != uVar24);
      }
      if (uVar29 < uVar11) {
        results.m_3color = true;
        results.lr = (int)local_278;
        results.lg = (int)local_280;
        results.lb = (int)local_288;
        results.hr = (int)local_290;
        results.hg = (int)local_298;
        results.hb = (int)local_2a0;
        results.sels[0] = trial_sels_1[0];
        results.sels[1] = trial_sels_1[1];
        results.sels[2] = trial_sels_1[2];
        results.sels[3] = trial_sels_1[3];
        results.sels[4] = trial_sels_1[4];
        results.sels[5] = trial_sels_1[5];
        results.sels[6] = trial_sels_1[6];
        results.sels[7] = trial_sels_1[7];
        results.sels[8] = trial_sels_1[8];
        results.sels[9] = trial_sels_1[9];
        results.sels[10] = trial_sels_1[10];
        results.sels[0xb] = trial_sels_1[0xb];
        results.sels[0xc] = trial_sels_1[0xc];
        results.sels[0xd] = trial_sels_1[0xd];
        results.sels[0xe] = trial_sels_1[0xe];
        results.sels[0xf] = trial_sels_1[0xf];
        uVar11 = uVar29;
      }
    }
    if (((flags & 8) != 0) && (bVar60)) {
      uVar20 = 0xff;
      lVar18 = 0;
      iVar30 = 0;
      iVar63 = 0;
      iVar39 = 0;
      iVar28 = 0;
      uVar50 = 0;
      uVar48 = 0;
      uVar29 = 0;
      uVar43 = 0xff;
      uVar40 = 0xff;
      do {
        bVar9 = pPixels[lVar18 * 4];
        uVar26 = (uint)pPixels[lVar18 * 4 + 1];
        bVar3 = pPixels[lVar18 * 4 + 2];
        if (3 < (byte)(pPixels[lVar18 * 4 + 1] | bVar9 | bVar3)) {
          uVar37 = (uint)bVar9;
          if (uVar50 <= uVar37) {
            uVar50 = uVar37;
          }
          if (uVar48 <= uVar26) {
            uVar48 = uVar26;
          }
          uVar78 = (uint)bVar3;
          if (uVar29 <= uVar78) {
            uVar29 = uVar78;
          }
          if (uVar37 <= uVar40) {
            uVar40 = (uint)bVar9;
          }
          if (uVar26 <= uVar43) {
            uVar43 = uVar26;
          }
          if (uVar78 <= uVar20) {
            uVar20 = (uint)bVar3;
          }
          iVar30 = iVar30 + (uint)bVar9;
          iVar63 = iVar63 + uVar26;
          iVar39 = iVar39 + (uint)bVar3;
          iVar28 = iVar28 + 1;
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0x10);
      if (iVar28 == 0) goto LAB_0011b6a3;
      iVar55 = iVar28 >> 1;
      iVar64 = (iVar30 + iVar55) / iVar28;
      iVar63 = (iVar63 + iVar55) / iVar28;
      iVar28 = (iVar39 + iVar55) / iVar28;
      round_sels[4] = '\0';
      round_sels[5] = '\0';
      round_sels[6] = '\0';
      round_sels[7] = '\0';
      round_sels[8] = '\0';
      round_sels[9] = '\0';
      round_sels[10] = '\0';
      round_sels[0xb] = '\0';
      round_sels[0xc] = '\0';
      round_sels[0xd] = '\0';
      round_sels[0xe] = '\0';
      round_sels[0xf] = '\0';
      lVar18 = 0;
      iVar39 = 0;
      iVar55 = 0;
      iVar30 = round_sels._8_4_;
      do {
        if (3 < (byte)(pPixels[lVar18 * 4 + 1] | pPixels[lVar18 * 4] | pPixels[lVar18 * 4 + 2])) {
          iVar15 = (uint)pPixels[lVar18 * 4] - iVar64;
          iVar23 = (uint)pPixels[lVar18 * 4 + 1] - iVar63;
          iVar52 = (uint)pPixels[lVar18 * 4 + 2] - iVar28;
          iVar55 = iVar55 + iVar15 * iVar15;
          round_sels._4_4_ = round_sels._4_4_ + iVar23 * iVar15;
          iVar30 = iVar30 + iVar15 * iVar52;
          round_sels._12_4_ = round_sels._12_4_ + iVar23 * iVar23;
          iVar39 = iVar39 + iVar52 * iVar23;
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0x10);
      uVar26 = (uint)round_sels._12_4_ >> 0x10;
      uVar37 = (uint)round_sels._12_4_ >> 0x18;
      round_sels[0xc] = (char)round_sels._12_4_;
      round_sels[0xd] = (char)((uint)round_sels._12_4_ >> 8);
      round_sels[0xe] = (char)uVar26;
      round_sels[0xf] = (char)uVar37;
      round_sels[8] = (char)iVar30;
      round_sels[9] = (char)((uint)iVar30 >> 8);
      round_sels[10] = (char)((uint)iVar30 >> 0x10);
      round_sels[0xb] = (char)((uint)iVar30 >> 0x18);
      uVar26 = (uint)round_sels._4_4_ >> 0x10;
      uVar37 = (uint)round_sels._4_4_ >> 0x18;
      round_sels[4] = (char)round_sels._4_4_;
      round_sels[5] = (char)((uint)round_sels._4_4_ >> 8);
      round_sels[6] = (char)uVar26;
      round_sels[7] = (char)uVar37;
      round_sels[0] = (char)iVar55;
      round_sels[1] = (char)((uint)iVar55 >> 8);
      round_sels[2] = (char)((uint)iVar55 >> 0x10);
      round_sels[3] = (char)((uint)iVar55 >> 0x18);
      lVar18 = 0;
      do {
        *(float *)(trial_sels + lVar18 * 4) = (float)*(int *)(round_sels + lVar18 * 4) * 0.003921569
        ;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 6);
      fVar68 = (float)(int)(uVar50 - uVar40);
      if (iVar30 < 0) {
        fVar68 = -fVar68;
      }
      fVar65 = (float)(int)(uVar48 - uVar43);
      if (iVar39 < 0) {
        fVar65 = -fVar65;
      }
      fVar85 = (float)(int)(uVar29 - uVar20);
      fVar69 = (float)local_b8;
      fVar66 = (float)((ulong)local_b8 >> 0x20);
      fVar86 = 0.0;
      fVar79 = 0.0;
      iVar30 = 4;
      fVar72 = 0.0;
      do {
        fVar76 = fVar72;
        fVar87 = fVar85 * (float)trial_sels._8_4_ +
                 fVar68 * (float)trial_sels._0_4_ + (float)trial_sels._4_4_ * fVar65;
        fVar72 = fVar65 * fVar69;
        fVar65 = fVar85 * fVar69 +
                 fVar68 * (float)trial_sels._4_4_ + fVar65 * (float)trial_sels._12_4_;
        fVar85 = fVar85 * fVar66 + fVar68 * (float)trial_sels._8_4_ + fVar72;
        iVar30 = iVar30 + -1;
        fVar68 = fVar87;
        fVar72 = fVar85;
      } while (iVar30 != 0);
      auVar74._0_4_ = ABS(fVar87);
      auVar74._4_4_ = 0;
      auVar74._8_4_ = ABS(fVar76);
      auVar74._12_4_ = ABS(fVar76);
      if (auVar74._0_4_ <= ABS(fVar65)) {
        auVar74._0_4_ = ABS(fVar65);
      }
      if (auVar74._0_4_ <= ABS(fVar85)) {
        auVar74._0_4_ = ABS(fVar85);
      }
      if (2.0 <= auVar74._0_4_) {
        fVar68 = 1024.0 / auVar74._0_4_;
        iVar30 = (int)(fVar87 * fVar68);
        iVar39 = (int)(fVar65 * fVar68);
        iVar55 = (int)(fVar85 * fVar68);
      }
      else {
        iVar39 = 0x259;
        iVar55 = 0x75;
        iVar30 = 0x132;
      }
      lVar18 = 0;
      iVar15 = 0x7fffffff;
      iVar23 = -0x80000000;
      uVar50 = 0;
      uVar48 = 0;
      do {
        if (3 < (byte)(pPixels[lVar18 * 4 + 1] | pPixels[lVar18 * 4] | pPixels[lVar18 * 4 + 2])) {
          iVar52 = (uint)pPixels[lVar18 * 4 + 2] * iVar55 +
                   (uint)pPixels[lVar18 * 4 + 1] * iVar39 + (uint)pPixels[lVar18 * 4] * iVar30;
          if (iVar52 < iVar15) {
            iVar15 = iVar52;
            uVar50 = (uint)lVar18;
          }
          if (iVar23 < iVar52) {
            uVar48 = (uint)lVar18;
            iVar23 = iVar52;
          }
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0x10);
      uVar17 = (ulong)uVar50;
      uVar33 = ((uint)pPixels[uVar17 * 4] * 0x1f + 0x80 >> 8) + (uint)pPixels[uVar17 * 4] * 0x1f +
               0x80 >> 8;
      local_308._0_4_ =
           ((uint)pPixels[uVar17 * 4 + 1] * 0x3f + 0x80 >> 8) + (uint)pPixels[uVar17 * 4 + 1] * 0x3f
           + 0x80 >> 8;
      local_398 = ((uint)pPixels[uVar17 * 4 + 2] * 0x1f + 0x80 >> 8) +
                  (uint)pPixels[uVar17 * 4 + 2] * 0x1f + 0x80 >> 8;
      uVar17 = (ulong)uVar48;
      local_3a0 = ((uint)pPixels[uVar17 * 4] * 0x1f + 0x80 >> 8) + (uint)pPixels[uVar17 * 4] * 0x1f
                  + 0x80 >> 8;
      uVar22 = ((uint)pPixels[uVar17 * 4 + 1] * 0x3f + 0x80 >> 8) +
               (uint)pPixels[uVar17 * 4 + 1] * 0x3f + 0x80 >> 8;
      uVar50 = ((uint)pPixels[uVar17 * 4 + 2] * 0x1f + 0x80 >> 8) +
               (uint)pPixels[uVar17 * 4 + 2] * 0x1f + 0x80 >> 8;
      local_2b8 = (byte *)(ulong)uVar50;
      uVar50 = bc1_find_sels3_fullerr
                         (true,(color32 *)pPixels,uVar33,(uint32_t)local_308,local_398,local_3a0,
                          uVar22,uVar50,(uint8_t *)b_sum,0xffffffff);
      if (uVar50 == 0) {
        uVar50 = 0;
      }
      else {
        lVar18 = (long)iVar64 * 3;
        lVar6 = (long)iVar63 * 3;
        lVar7 = (long)iVar28 * 3;
        iVar30 = 0;
        do {
          lVar42 = 0;
          iVar39 = 0;
          uVar48 = 0;
          iVar28 = 0;
          iVar55 = 0;
          iVar15 = 0;
          iVar63 = 0;
          iVar64 = 0;
          do {
            bVar9 = pPixels[lVar42 * 4];
            bVar3 = pPixels[lVar42 * 4 + 2];
            bVar4 = pPixels[lVar42 * 4 + 1];
            if ((3 < (byte)(bVar4 | bVar9 | bVar3)) &&
               (uVar17 = (ulong)*(byte *)((long)b_sum + lVar42), uVar17 != 3)) {
              uVar48 = uVar48 + (&g_weight_vals3)[uVar17];
              bVar5 = *(byte *)((long)&compute_least_squares_endpoints3_rgb(bool,rgbcx::color32_const*,unsigned_char_const*,rgbcx::vec3F*,rgbcx::vec3F*)
                                       ::s_tran + uVar17);
              auVar71._8_8_ = 0;
              auVar71._0_8_ = (ulong)bVar9 | (ulong)(uint)bVar3 << 0x20;
              iVar39 = iVar39 + (uint)bVar5 * (uint)bVar4;
              auVar75 = pmaddwd(ZEXT516(CONCAT14(bVar5,(uint)bVar5)),auVar71);
              iVar55 = iVar55 + auVar75._0_4_;
              iVar15 = iVar15 + auVar75._4_4_;
              iVar28 = iVar28 + (uint)bVar4;
              iVar63 = iVar63 + (uint)bVar9;
              iVar64 = iVar64 + (uint)bVar3;
            }
            lVar42 = lVar42 + 1;
          } while (lVar42 != 0x10);
          fVar68 = (float)(uVar48 >> 0x10 & 0xff);
          uVar29 = uVar48 >> 8 & 0xff;
          fVar65 = fVar68 * (float)(uVar48 & 0xff) - (float)(uVar29 * uVar29);
          if (1e-08 <= ABS(fVar65)) {
            fVar65 = 0.007843138 / fVar65;
            fVar68 = fVar68 * fVar65;
            fVar87 = (float)(iVar28 * 2 - iVar39);
            fVar85 = -(float)uVar29 * fVar65;
            fVar65 = (float)(uVar48 & 0xff) * fVar65;
            fVar79 = (float)(iVar63 * 2 - iVar55);
            fVar72 = (float)(iVar64 * 2 - iVar15);
            fVar69 = fVar68 * fVar79 + fVar85 * (float)iVar55;
            fVar66 = fVar85 * fVar79 + fVar65 * (float)iVar55;
            fVar86 = fVar68 * fVar72 + fVar85 * (float)iVar15;
            fVar79 = fVar85 * fVar72 + fVar65 * (float)iVar15;
            fVar68 = (float)iVar39 * fVar85 + fVar87 * fVar68;
            fVar65 = (float)iVar39 * fVar65 + fVar87 * fVar85;
            uVar48 = (uint)(fVar69 * 31.0);
            uVar29 = (uint)(fVar66 * 31.0);
            uVar40 = (uint)(fVar86 * 31.0);
            uVar43 = (uint)(fVar79 * 31.0);
            if (0x1f < (uVar43 | uVar29 | uVar40 | uVar48)) {
              uVar48 = -(uint)((int)0 < (int)uVar48) & uVar48;
              uVar29 = -(uint)((int)0 < (int)uVar29) & uVar29;
              uVar40 = -(uint)((int)0 < (int)uVar40) & uVar40;
              uVar43 = -(uint)((int)0 < (int)uVar43) & uVar43;
              uVar20 = -(uint)((int)uVar48 < 0x1f);
              uVar26 = -(uint)((int)uVar29 < 0x1f);
              uVar37 = -(uint)((int)uVar40 < 0x1f);
              uVar78 = -(uint)((int)uVar43 < 0x1f);
              uVar48 = ~uVar20 & 0x1f | uVar48 & uVar20;
              uVar29 = ~uVar26 & 0x1f | uVar29 & uVar26;
              uVar40 = ~uVar37 & 0x1f | uVar40 & uVar37;
              uVar43 = ~uVar78 & 0x1f | uVar43 & uVar78;
            }
            uVar26 = (uint)(fVar65 * 63.0);
            uVar20 = (uint)(fVar68 * 63.0);
            if (0x3f < (uVar20 | uVar26)) {
              if ((int)uVar26 < 1) {
                uVar26 = 0;
              }
              if (0x3e < (int)uVar26) {
                uVar26 = 0x3f;
              }
              if ((int)uVar20 < 1) {
                uVar20 = 0;
              }
              if (0x3e < (int)uVar20) {
                uVar20 = 0x3f;
              }
            }
            uVar51 = uVar29 + (*(float *)(g_midpoint5 + (long)(int)uVar29 * 4) <= fVar66 &&
                              fVar66 != *(float *)(g_midpoint5 + (long)(int)uVar29 * 4)) & 0x1f;
            uVar49 = uVar26 + (*(float *)(g_midpoint6 + (long)(int)uVar26 * 4) <= fVar65 &&
                              fVar65 != *(float *)(g_midpoint6 + (long)(int)uVar26 * 4)) & 0x3f;
            pbVar59 = (byte *)(ulong)(uVar43 + (*(float *)(g_midpoint5 + (long)(int)uVar43 * 4) <=
                                                fVar79 &&
                                               fVar79 != *(float *)(g_midpoint5 +
                                                                   (long)(int)uVar43 * 4)) & 0x1f);
            uVar53 = uVar48 + (*(float *)(g_midpoint5 + (long)(int)uVar48 * 4) <= fVar69 &&
                              fVar69 != *(float *)(g_midpoint5 + (long)(int)uVar48 * 4)) & 0x1f;
            uVar54 = uVar20 + (*(float *)(g_midpoint6 + (long)(int)uVar20 * 4) <= fVar68 &&
                              fVar68 != *(float *)(g_midpoint6 + (long)(int)uVar20 * 4)) & 0x3f;
            uVar35 = uVar40 + (*(float *)(g_midpoint5 + (long)(int)uVar40 * 4) <= fVar86 &&
                              fVar86 != *(float *)(g_midpoint5 + (long)(int)uVar40 * 4)) & 0x1f;
          }
          else {
            uVar53 = (uint32_t)(byte)g_bc1_match5_half[lVar18];
            uVar54 = (uint32_t)(byte)g_bc1_match6_half[lVar6];
            uVar35 = (uint32_t)(byte)g_bc1_match5_half[lVar7];
            uVar51 = (uint32_t)(byte)g_bc1_match5_half[lVar18 + 1];
            uVar49 = (uint32_t)(byte)g_bc1_match6_half[lVar6 + 1];
            pbVar59 = (byte *)(ulong)(byte)g_bc1_match5_half[lVar7 + 1];
          }
          if ((((uVar33 == uVar53) && ((uint32_t)local_308 == uVar54)) && (local_398 == uVar35)) &&
             (((local_3a0 == uVar51 && (uVar22 == uVar49)) &&
              ((float)local_2b8 == (float)(uint32_t)pbVar59)))) {
            bVar61 = false;
          }
          else {
            local_258 = (byte *)CONCAT44(fVar66,fVar69);
            fStack_250 = fVar86;
            fStack_24c = fVar79;
            uVar57 = bc1_find_sels3_fullerr
                               (true,(color32 *)pPixels,uVar53,uVar54,uVar35,uVar51,uVar49,
                                (uint32_t)pbVar59,(uint8_t *)dots,uVar50);
            bVar61 = uVar57 < uVar50;
            if (bVar61) {
              b_sum[0] = dots[0];
              b_sum[1] = dots[1];
              b_sum[2] = dots[2];
              b_sum[3] = dots[3];
              local_2b8 = pbVar59;
              uVar33 = uVar53;
              local_308._0_4_ = uVar54;
              local_398 = uVar35;
              local_3a0 = uVar51;
              uVar50 = uVar57;
              uVar22 = uVar49;
            }
            fVar69 = (float)local_258;
            fVar66 = local_258._4_4_;
            fVar86 = fStack_250;
            fVar79 = fStack_24c;
          }
        } while (((bVar61) && ((flags & 4) != 0)) &&
                (bVar61 = iVar30 == 0, iVar30 = iVar30 + 1, bVar61));
      }
      if (uVar50 < uVar11) {
        results.m_3color = true;
        results.lg = (uint32_t)local_308;
        results.lr = uVar33;
        results.lb = local_398;
        results.hr = local_3a0;
        results.hg = uVar22;
        results.hb = (int)local_2b8;
        results.sels._0_8_ = b_sum._0_8_;
        results.sels._8_8_ = b_sum._8_8_;
        uVar11 = uVar50;
      }
    }
  }
LAB_0011b6a3:
  bVar61 = results.m_3color;
  if ((0x3fffff < flags) && (uVar11 != 0)) {
    local_2e8._0_4_ = results.hb;
    local_2f8._0_4_ = (float)results.hg;
    local_308._0_4_ = results.hr;
    local_398 = results.lb;
    local_3a0 = results.lr;
    local_338 = results.lg;
    uVar50 = 0xffffffff;
    local_2b8 = (byte *)((ulong)(uint)local_2b8._4_4_ << 0x20);
    uVar48 = 0;
    do {
      if (uVar50 != (uVar48 & 0x1f)) {
        uVar17 = (ulong)(uVar48 & 0xf);
        local_258 = (byte *)(CONCAT44(local_258._4_4_,uVar48) & 0xffffffff00000010);
        if ((uVar48 & 0x10) == 0) {
          uVar51 = (int)(char)s_adjacent_voxels[uVar17 * 4] + (uint32_t)local_308;
          if (0x1e < (int)uVar51) {
            uVar51 = 0x1f;
          }
          if ((int)uVar51 < 1) {
            uVar51 = 0;
          }
          uVar53 = (int)(char)s_adjacent_voxels[uVar17 * 4 + 1] + (int)(float)local_2f8;
          if (0x3e < (int)uVar53) {
            uVar53 = 0x3f;
          }
          if ((int)uVar53 < 1) {
            uVar53 = 0;
          }
          uVar49 = (int)(char)s_adjacent_voxels[uVar17 * 4 + 2] + local_2e8._0_4_;
          if (0x1e < (int)uVar49) {
            uVar49 = 0x1f;
          }
          uVar22 = local_3a0;
          uVar33 = local_338;
          uVar35 = local_398;
          if ((int)uVar49 < 1) {
            uVar49 = 0;
          }
        }
        else {
          uVar22 = (int)(char)s_adjacent_voxels[uVar17 * 4] + local_3a0;
          if (0x1e < (int)uVar22) {
            uVar22 = 0x1f;
          }
          if ((int)uVar22 < 1) {
            uVar22 = 0;
          }
          uVar33 = (int)(char)s_adjacent_voxels[uVar17 * 4 + 1] + local_338;
          if (0x3e < (int)uVar33) {
            uVar33 = 0x3f;
          }
          if ((int)uVar33 < 1) {
            uVar33 = 0;
          }
          uVar35 = (int)(char)s_adjacent_voxels[uVar17 * 4 + 2] + local_398;
          if (0x1e < (int)uVar35) {
            uVar35 = 0x1f;
          }
          uVar51 = (uint32_t)local_308;
          uVar53 = (uint32_t)(float)local_2f8;
          uVar49 = local_2e8._0_4_;
          if ((int)uVar35 < 1) {
            uVar35 = 0;
          }
        }
        if ((bVar61 & 1U) == 0) {
          uVar29 = bc1_find_sels4(flags,(color32 *)pPixels,uVar22,uVar33,uVar35,uVar51,uVar53,uVar49
                                  ,round_sels,uVar11);
        }
        else {
          uVar29 = bc1_find_sels3_fullerr
                             ((bool)((byte)flags >> 3 & bVar60),(color32 *)pPixels,uVar22,uVar33,
                              uVar35,uVar51,uVar53,uVar49,round_sels,uVar11);
        }
        if (uVar29 < uVar11) {
          uVar50 = (uint)(float)local_258 | (int)(char)s_adjacent_voxels[uVar17 * 4 + 3];
          results.lg = uVar33;
          results.lr = uVar22;
          results.hr = uVar51;
          results.lb = uVar35;
          results.hb = uVar49;
          results.hg = uVar53;
          results.sels[0] = round_sels[0];
          results.sels[1] = round_sels[1];
          results.sels[2] = round_sels[2];
          results.sels[3] = round_sels[3];
          results.sels[4] = round_sels[4];
          results.sels[5] = round_sels[5];
          results.sels[6] = round_sels[6];
          results.sels[7] = round_sels[7];
          results.sels[8] = round_sels[8];
          results.sels[9] = round_sels[9];
          results.sels[10] = round_sels[10];
          results.sels[0xb] = round_sels[0xb];
          results.sels[0xc] = round_sels[0xc];
          results.sels[0xd] = round_sels[0xd];
          results.sels[0xe] = round_sels[0xe];
          results.sels[0xf] = round_sels[0xf];
          local_2b8 = (byte *)CONCAT44(local_2b8._4_4_,uVar48);
          local_2e8._0_4_ = uVar49;
          local_2f8._0_4_ = (float)uVar53;
          local_308._0_4_ = uVar51;
          local_398 = uVar35;
          local_338 = uVar33;
          local_3a0 = uVar22;
          uVar11 = uVar29;
        }
        if (0x20 < (int)(uVar48 - (int)(float)local_2b8)) break;
      }
      uVar48 = uVar48 + 1;
    } while (flags >> 0x16 != uVar48);
  }
  uVar29 = results.lr << 0xb | results.lb | results.lg << 5;
  uVar48 = uVar29 & 0xffff;
  sVar32 = (short)uVar29;
  uVar50 = results.hr << 0xb | results.hb | results.hg << 5;
  uVar11 = uVar50 & 0xffff;
  sVar10 = (short)uVar50;
  if (results.m_3color == true) {
    puVar46 = results.sels;
    uVar25 = (undefined1)(uVar50 >> 8);
    uVar34 = (undefined1)(uVar29 >> 8);
    if (uVar11 < uVar48) {
      *local_270 = (char)uVar50;
      local_270[1] = uVar25;
      local_270[2] = (char)uVar29;
      local_270[3] = uVar34;
      lVar18 = 0;
      uVar11 = 0;
      do {
        uVar11 = uVar11 | (uint)*(byte *)((long)&bc1_encode3(rgbcx::bc1_block*,int,int,int,int,int,int,unsigned_char_const*)
                                                 ::s_sel_trans_inv + (ulong)*puVar46) <<
                          ((byte)lVar18 & 0x1f);
        lVar18 = lVar18 + 2;
        puVar46 = puVar46 + 1;
      } while (lVar18 != 0x20);
    }
    else {
      *local_270 = (char)uVar29;
      local_270[1] = uVar34;
      local_270[2] = (char)uVar50;
      local_270[3] = uVar25;
      lVar18 = 0;
      uVar11 = 0;
      do {
        uVar11 = uVar11 | (uint)*puVar46 << ((byte)lVar18 & 0x1f);
        lVar18 = lVar18 + 2;
        puVar46 = puVar46 + 1;
      } while (lVar18 != 0x20);
    }
    *(uint *)(local_270 + 4) = uVar11;
  }
  else {
    puVar46 = results.sels;
    if (uVar48 != uVar11) {
      sVar8 = sVar10;
      if (uVar48 >= uVar11 && uVar48 != uVar11) {
        sVar8 = sVar32;
      }
      if (uVar48 < uVar11) {
        sVar10 = sVar32;
      }
      *local_270 = (char)sVar8;
      local_270[1] = (char)((ushort)sVar8 >> 8);
      local_270[2] = (char)sVar10;
      local_270[3] = (char)((ushort)sVar10 >> 8);
      lVar18 = 0;
      uVar50 = 0;
      do {
        uVar50 = uVar50 | (uint)*(byte *)((long)&bc1_encode4(rgbcx::bc1_block*,int,int,int,int,int,int,unsigned_char_const*)
                                                 ::s_sel_trans + (ulong)*puVar46) <<
                          ((byte)lVar18 & 0x1f);
        lVar18 = lVar18 + 2;
        puVar46 = puVar46 + 1;
      } while (lVar18 != 0x20);
      bVar9 = 0x55;
      if (uVar11 <= uVar48) {
        bVar9 = 0;
      }
      local_270[4] = (byte)uVar50 ^ bVar9;
      local_270[5] = (byte)(uVar50 >> 8) ^ bVar9;
      local_270[6] = (byte)(uVar50 >> 0x10) ^ bVar9;
      local_270[7] = (byte)(uVar50 >> 0x18) ^ bVar9;
    }
    else {
      bVar60 = uVar11 == 0;
      if (bVar60) {
        sVar32 = 1;
      }
      *local_270 = (char)sVar32;
      local_270[1] = (char)((ushort)sVar32 >> 8);
      sVar32 = sVar10 + -1;
      if (bVar60) {
        sVar32 = sVar10;
      }
      local_270[2] = (char)sVar32;
      local_270[3] = (char)((ushort)sVar32 >> 8);
      uVar16 = 0x55555555;
      if (!bVar60) {
        uVar16 = 0;
      }
      *(undefined4 *)(local_270 + 4) = uVar16;
    }
  }
  return;
}

Assistant:

void encode_bc1(void* pDst, const uint8_t* pPixels, uint32_t flags, uint32_t total_orderings_to_try, uint32_t total_orderings_to_try3)
	{
		assert(g_initialized);
				
		const color32* pSrc_pixels = (const color32*)pPixels;
		bc1_block* pDst_block = static_cast<bc1_block*>(pDst);
		
		int avg_r, avg_g, avg_b, min_r, min_g, min_b, max_r, max_g, max_b;
						
		const uint32_t fr = pSrc_pixels[0].r, fg = pSrc_pixels[0].g, fb = pSrc_pixels[0].b;

		uint32_t j;
		for (j = 15; j >= 1; --j)
			if ((pSrc_pixels[j].r != fr) || (pSrc_pixels[j].g != fg) || (pSrc_pixels[j].b != fb))
				break;

		if (j == 0)
		{
			encode_bc1_solid_block(pDst, fr, fg, fb, (flags & (cEncodeBC1Use3ColorBlocks | cEncodeBC1Use3ColorBlocksForBlackPixels)) != 0);
			return;
		}

		int total_r = fr, total_g = fg, total_b = fb;
		
		max_r = fr, max_g = fg, max_b = fb;
		min_r = fr, min_g = fg, min_b = fb;
		
		uint32_t grayscale_flag = (fr == fg) && (fr == fb);
		uint32_t any_black_pixels = (fr | fg | fb) < 4;

		for (uint32_t i = 1; i < 16; i++)
		{
			const int r = pSrc_pixels[i].r, g = pSrc_pixels[i].g, b = pSrc_pixels[i].b;
			
			grayscale_flag &= ((r == g) && (r == b));
			any_black_pixels |= ((r | g | b) < 4);

			max_r = std::max(max_r, r); max_g = std::max(max_g, g); max_b = std::max(max_b, b);
			min_r = std::min(min_r, r); min_g = std::min(min_g, g); min_b = std::min(min_b, b);
			total_r += r; total_g += g; total_b += b;
		}

		avg_r = (total_r + 8) >> 4, avg_g = (total_g + 8) >> 4, avg_b = (total_b + 8) >> 4;

		bc1_encode_results results;
		results.m_3color = false;

		uint8_t *sels = results.sels;
		int &lr = results.lr, &lg = results.lg, &lb = results.lb, &hr = results.hr, &hg = results.hg, &hb = results.hb;
		int orig_lr = 0, orig_lg = 0, orig_lb = 0, orig_hr = 0, orig_hg = 0, orig_hb = 0;

		lr = 0, lg = 0, lb = 0, hr = 0, hg = 0, hb = 0;
								
		const bool needs_block_error = ((flags & (cEncodeBC1UseLikelyTotalOrderings | cEncodeBC1Use3ColorBlocks | cEncodeBC1UseFullMSEEval | cEncodeBC1EndpointSearchRoundsMask)) != 0) ||
				(any_black_pixels && ((flags & cEncodeBC1Use3ColorBlocksForBlackPixels) != 0));
		
		uint32_t cur_err = UINT32_MAX;

		if (!needs_block_error)
		{
			assert((flags & cEncodeBC1TryAllInitialEndponts) == 0);

			encode_bc1_pick_initial(pSrc_pixels, flags, grayscale_flag != 0,
					min_r, min_g, min_b, max_r, max_g, max_b, 
					avg_r, avg_g, avg_b, total_r, total_g, total_b,
					lr, lg, lb, hr, hg, hb);

			orig_lr = lr, orig_lg = lg, orig_lb = lb, orig_hr = hr, orig_hg = hg, orig_hb = hb;

			bc1_find_sels4_noerr(pSrc_pixels, lr, lg, lb, hr, hg, hb, sels);

			const uint32_t total_ls_passes = flags & cEncodeBC1TwoLeastSquaresPasses ? 2 : 1;
			for (uint32_t ls_pass = 0; ls_pass < total_ls_passes; ls_pass++)
			{
				int trial_lr, trial_lg, trial_lb, trial_hr, trial_hg, trial_hb;

				vec3F xl, xh;
				if (!compute_least_squares_endpoints4_rgb(pSrc_pixels, sels, &xl, &xh, total_r, total_g, total_b))
				{
					// All selectors equal - treat it as a solid block which should always be equal or better.
					trial_lr = g_bc1_match5_equals_1[avg_r].m_hi;
					trial_lg = g_bc1_match6_equals_1[avg_g].m_hi;
					trial_lb = g_bc1_match5_equals_1[avg_b].m_hi;

					trial_hr = g_bc1_match5_equals_1[avg_r].m_lo;
					trial_hg = g_bc1_match6_equals_1[avg_g].m_lo;
					trial_hb = g_bc1_match5_equals_1[avg_b].m_lo;

					// In high/higher quality mode, let it try again in case the optimal tables have caused the sels to diverge.
				}
				else
				{
					precise_round_565(xl, xh, trial_hr, trial_hg, trial_hb, trial_lr, trial_lg, trial_lb);
				}

				if ((lr == trial_lr) && (lg == trial_lg) && (lb == trial_lb) && (hr == trial_hr) && (hg == trial_hg) && (hb == trial_hb))
					break;
			
				bc1_find_sels4_noerr(pSrc_pixels, trial_lr, trial_lg, trial_lb, trial_hr, trial_hg, trial_hb, sels);

				lr = trial_lr;
				lg = trial_lg;
				lb = trial_lb;
				hr = trial_hr;
				hg = trial_hg;
				hb = trial_hb;

			} // ls_pass
		}
		else
		{
			const uint32_t total_rounds = (flags & cEncodeBC1TryAllInitialEndponts) ? 2 : 1;
			for (uint32_t round = 0; round < total_rounds; round++)
			{
				uint32_t modified_flags = flags;
				if (round == 1)
				{
					modified_flags &= ~(cEncodeBC1Use2DLS | cEncodeBC1BoundingBox);
					modified_flags |= cEncodeBC1BoundingBox;
				}

				int round_lr, round_lg, round_lb, round_hr, round_hg, round_hb;
				uint8_t round_sels[16];

				encode_bc1_pick_initial(pSrc_pixels, modified_flags, grayscale_flag != 0,
					min_r, min_g, min_b, max_r, max_g, max_b, 
					avg_r, avg_g, avg_b, total_r, total_g, total_b,
					round_lr, round_lg, round_lb, round_hr, round_hg, round_hb);

				int orig_round_lr = round_lr, orig_round_lg = round_lg, orig_round_lb = round_lb, orig_round_hr = round_hr, orig_round_hg = round_hg, orig_round_hb = round_hb;

				uint32_t round_err = bc1_find_sels4(flags, pSrc_pixels, round_lr, round_lg, round_lb, round_hr, round_hg, round_hb, round_sels, UINT32_MAX);
						
				const uint32_t total_ls_passes = flags & cEncodeBC1TwoLeastSquaresPasses ? 2 : 1;
				for (uint32_t ls_pass = 0; ls_pass < total_ls_passes; ls_pass++)
				{
					int trial_lr, trial_lg, trial_lb, trial_hr, trial_hg, trial_hb;

					vec3F xl, xh;
					if (!compute_least_squares_endpoints4_rgb(pSrc_pixels, round_sels, &xl, &xh, total_r, total_g, total_b))
					{
						// All selectors equal - treat it as a solid block which should always be equal or better.
						trial_lr = g_bc1_match5_equals_1[avg_r].m_hi;
						trial_lg = g_bc1_match6_equals_1[avg_g].m_hi;
						trial_lb = g_bc1_match5_equals_1[avg_b].m_hi;

						trial_hr = g_bc1_match5_equals_1[avg_r].m_lo;
						trial_hg = g_bc1_match6_equals_1[avg_g].m_lo;
						trial_hb = g_bc1_match5_equals_1[avg_b].m_lo;

						// In high/higher quality mode, let it try again in case the optimal tables have caused the sels to diverge.
					}
					else
					{
						precise_round_565(xl, xh, trial_hr, trial_hg, trial_hb, trial_lr, trial_lg, trial_lb);
					}

					if ((round_lr == trial_lr) && (round_lg == trial_lg) && (round_lb == trial_lb) && (round_hr == trial_hr) && (round_hg == trial_hg) && (round_hb == trial_hb))
						break;
			
					uint8_t trial_sels[16];
					uint32_t trial_err = bc1_find_sels4(flags, pSrc_pixels, trial_lr, trial_lg, trial_lb, trial_hr, trial_hg, trial_hb, trial_sels, round_err);
														
					if (trial_err < round_err)
					{
						round_lr = trial_lr;
						round_lg = trial_lg;
						round_lb = trial_lb;

						round_hr = trial_hr;
						round_hg = trial_hg;
						round_hb = trial_hb;

						round_err = trial_err;
						memcpy(round_sels, trial_sels, 16);
					}
					else
						break;

				} // ls_pass

				if (round_err <= cur_err)
				{
					cur_err = round_err;
				
					lr = round_lr;
					lg = round_lg;
					lb = round_lb;
					hr = round_hr;
					hg = round_hg;
					hb = round_hb;

					orig_lr = orig_round_lr;
					orig_lg = orig_round_lg;
					orig_lb = orig_round_lb;
					orig_hr = orig_round_hr;
					orig_hg = orig_round_hg;
					orig_hb = orig_round_hb;

					memcpy(sels, round_sels, 16);
				}

			} // round
		}
				
		if ((cur_err) && (flags & cEncodeBC1UseLikelyTotalOrderings))
		{
			assert(needs_block_error);

			const uint32_t total_iters = (flags & cEncodeBC1Iterative) ? 2 : 1;
			for (uint32_t iter_index = 0; iter_index < total_iters; iter_index++)
			{
				const uint32_t orig_err = cur_err;
								
				hist4 h;
				for (uint32_t i = 0; i < 16; i++)
				{
					assert(sels[i] < 4);
					h.m_hist[sels[i]]++;
				}

				const uint32_t orig_total_order_index = h.lookup_total_ordering_index();

				int r0, g0, b0, r3, g3, b3;
				r0 = (lr << 3) | (lr >> 2); g0 = (lg << 2) | (lg >> 4); b0 = (lb << 3) | (lb >> 2);
				r3 = (hr << 3) | (hr >> 2); g3 = (hg << 2) | (hg >> 4); b3 = (hb << 3) | (hb >> 2);
										
				int ar = r3 - r0, ag = g3 - g0, ab = b3 - b0;
												
				int dots[16];
				for (uint32_t i = 0; i < 16; i++)
				{
					int r = pSrc_pixels[i].r;
					int g = pSrc_pixels[i].g;
					int b = pSrc_pixels[i].b;
					int d = 0x1000000 + (r * ar + g * ag + b * ab);
					assert(d >= 0);
					dots[i] = (d << 4) + i;
				}

				std::sort(dots, dots + 16);
								
				uint32_t r_sum[17], g_sum[17], b_sum[17];
				uint32_t r = 0, g = 0, b = 0;
				for (uint32_t i = 0; i < 16; i++)
				{
					const uint32_t p = dots[i] & 15;

					r_sum[i] = r;
					g_sum[i] = g;
					b_sum[i] = b;
										
					r += pSrc_pixels[p].r;
					g += pSrc_pixels[p].g;
					b += pSrc_pixels[p].b;
				}

				r_sum[16] = total_r;
				g_sum[16] = total_g;
				b_sum[16] = total_b;

				const uint32_t q_total = (flags & cEncodeBC1Exhaustive) ? NUM_UNIQUE_TOTAL_ORDERINGS4 : clampi(total_orderings_to_try, MIN_TOTAL_ORDERINGS, MAX_TOTAL_ORDERINGS4);
				for (uint32_t q = 0; q < q_total; q++)
				{
					const uint32_t s = (flags & cEncodeBC1Exhaustive) ? q : g_best_total_orderings4[orig_total_order_index][q];
	
					int trial_lr, trial_lg, trial_lb, trial_hr, trial_hg, trial_hb;

					vec3F xl, xh;

					if ((s == TOTAL_ORDER_4_0_16) || (s == TOTAL_ORDER_4_1_16) || (s == TOTAL_ORDER_4_2_16) || (s == TOTAL_ORDER_4_3_16))
					{
						trial_lr = g_bc1_match5_equals_1[avg_r].m_hi;
						trial_lg = g_bc1_match6_equals_1[avg_g].m_hi;
						trial_lb = g_bc1_match5_equals_1[avg_b].m_hi;

						trial_hr = g_bc1_match5_equals_1[avg_r].m_lo;
						trial_hg = g_bc1_match6_equals_1[avg_g].m_lo;
						trial_hb = g_bc1_match5_equals_1[avg_b].m_lo;
					}
					else
					{
						compute_least_squares_endpoints4_rgb(&xl, &xh, total_r, total_g, total_b, 
							g_selector_factors4[s][0], g_selector_factors4[s][1], g_selector_factors4[s][2], s, r_sum, g_sum, b_sum);
				
						precise_round_565(xl, xh, trial_hr, trial_hg, trial_hb, trial_lr, trial_lg, trial_lb);
					}
										
					uint8_t trial_sels[16];
					
					uint32_t trial_err = bc1_find_sels4(flags, pSrc_pixels, trial_lr, trial_lg, trial_lb, trial_hr, trial_hg, trial_hb, trial_sels, cur_err);

					if (trial_err < cur_err)
					{
						cur_err = trial_err;

						lr = trial_lr;
						lg = trial_lg;
						lb = trial_lb;

						hr = trial_hr;
						hg = trial_hg;
						hb = trial_hb;

						memcpy(sels, trial_sels, 16);
					}

				} // s

				if ((!cur_err) || (cur_err == orig_err))
					break;
			
			} // iter_index
		}
												
		if ( ((flags & (cEncodeBC1Use3ColorBlocks | cEncodeBC1Use3ColorBlocksForBlackPixels)) != 0) && (cur_err) )
		{
			if (flags & cEncodeBC1Use3ColorBlocks)
			{
				assert(needs_block_error);
				try_3color_block(pSrc_pixels, flags, cur_err, avg_r, avg_g, avg_b, orig_lr, orig_lg, orig_lb, orig_hr, orig_hg, orig_hb, total_r, total_g, total_b, total_orderings_to_try3, results);
			}

			if ((any_black_pixels) && ((flags & cEncodeBC1Use3ColorBlocksForBlackPixels) != 0))
			{
				assert(needs_block_error);
				try_3color_block_useblack(pSrc_pixels, flags, cur_err, results);
			}
		}
		
		if ( (flags & cEncodeBC1EndpointSearchRoundsMask) && (cur_err)  )
		{
			assert(needs_block_error);

			encode_bc1_endpoint_search(pSrc_pixels, any_black_pixels != 0, flags, results, cur_err);
		}

		if (results.m_3color)
			bc1_encode3(pDst_block, results.lr, results.lg, results.lb, results.hr, results.hg, results.hb, results.sels);
		else
			bc1_encode4(pDst_block, results.lr, results.lg, results.lb, results.hr, results.hg, results.hb, results.sels);
	}